

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationDataBuilder::copyContractionsFromBaseCE32
          (CollationDataBuilder *this,UnicodeString *context,UChar32 c,uint32_t ce32,
          ConditionalCE32 *cond,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  uint32_t uVar3;
  UChar *pUVar4;
  UnicodeString *srcText;
  __off_t __length;
  ConstChar16Ptr local_c8;
  undefined1 local_c0 [8];
  Iterator suffixes;
  int32_t suffixStart;
  int32_t index;
  UChar *p;
  UErrorCode *errorCode_local;
  ConditionalCE32 *cond_local;
  uint32_t ce32_local;
  UChar32 c_local;
  UnicodeString *context_local;
  CollationDataBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pUVar4 = this->base->contexts;
    iVar2 = Collation::indexFromCE32(ce32);
    pUVar4 = pUVar4 + iVar2;
    if ((ce32 & 0x100) == 0) {
      uVar3 = CollationData::readCE32(pUVar4);
      uVar3 = copyFromBaseCE32(this,c,uVar3,'\x01',errorCode);
      suffixes.stack_._4_4_ = addConditionalCE32(this,context,uVar3,errorCode);
      cond->next = suffixes.stack_._4_4_;
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        return 0;
      }
      errorCode_local = (UErrorCode *)getConditionalCE32(this,suffixes.stack_._4_4_);
    }
    else {
      suffixes.stack_._4_4_ = ~U_ZERO_ERROR;
      errorCode_local = (UErrorCode *)cond;
    }
    suffixes.stack_._0_4_ = UnicodeString::length(context);
    ConstChar16Ptr::ConstChar16Ptr(&local_c8,pUVar4 + 2);
    UCharsTrie::Iterator::Iterator((Iterator *)local_c0,&local_c8,0,errorCode);
    ConstChar16Ptr::~ConstChar16Ptr(&local_c8);
    while (UVar1 = UCharsTrie::Iterator::next((Iterator *)local_c0,errorCode), UVar1 != '\0') {
      srcText = UCharsTrie::Iterator::getString((Iterator *)local_c0);
      UnicodeString::append(context,srcText);
      uVar3 = UCharsTrie::Iterator::getValue((Iterator *)local_c0);
      uVar3 = copyFromBaseCE32(this,c,uVar3,'\x01',errorCode);
      suffixes.stack_._4_4_ = addConditionalCE32(this,context,uVar3,errorCode);
      errorCode_local[0x15] = suffixes.stack_._4_4_;
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 != '\0') {
        this_local._4_4_ = U_ZERO_ERROR;
        goto LAB_0029300c;
      }
      errorCode_local = (UErrorCode *)getConditionalCE32(this,suffixes.stack_._4_4_);
      UnicodeString::truncate(context,(char *)(ulong)(uint)suffixes.stack_,__length);
    }
    this_local._4_4_ = suffixes.stack_._4_4_;
LAB_0029300c:
    UCharsTrie::Iterator::~Iterator((Iterator *)local_c0);
  }
  else {
    this_local._4_4_ = U_ZERO_ERROR;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationDataBuilder::copyContractionsFromBaseCE32(UnicodeString &context, UChar32 c, uint32_t ce32,
                                                   ConditionalCE32 *cond, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
    int32_t index;
    if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
        // No match on the single code point.
        // We are underneath a prefix, and the default mapping is just
        // a fallback to the mappings for a shorter prefix.
        U_ASSERT(context.length() > 1);
        index = -1;
    } else {
        ce32 = CollationData::readCE32(p);  // Default if no suffix match.
        U_ASSERT(!Collation::isContractionCE32(ce32));
        ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
        cond->next = index = addConditionalCE32(context, ce32, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        cond = getConditionalCE32(index);
    }

    int32_t suffixStart = context.length();
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        context.append(suffixes.getString());
        ce32 = copyFromBaseCE32(c, (uint32_t)suffixes.getValue(), TRUE, errorCode);
        cond->next = index = addConditionalCE32(context, ce32, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        // No need to update the unsafeBackwardSet because the tailoring set
        // is already a copy of the base set.
        cond = getConditionalCE32(index);
        context.truncate(suffixStart);
    }
    U_ASSERT(index >= 0);
    return index;
}